

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void insert_PNode_internal(Parser *p,PNode *pn)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  D_Scope *pDVar5;
  PNode **ppPVar6;
  PNode *pn_00;
  PNode **ppPVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pcVar3 = (pn->parse_node).start_loc.s;
  pcVar4 = (pn->parse_node).end_skip;
  iVar1 = (pn->parse_node).symbol;
  pDVar5 = pn->initial_scope;
  uVar2 = (p->pnode_hash).m;
  uVar9 = (ulong)uVar2;
  uVar8 = (p->pnode_hash).n + 1;
  if (uVar2 < uVar8) {
    ppPVar6 = (p->pnode_hash).v;
    uVar8 = (p->pnode_hash).i + 1;
    (p->pnode_hash).i = uVar8;
    uVar8 = d_prime2[uVar8];
    (p->pnode_hash).m = uVar8;
    ppPVar7 = (PNode **)calloc(1,(ulong)uVar8 << 3);
    (p->pnode_hash).v = ppPVar7;
    if (uVar2 != 0) {
      uVar10 = 0;
      do {
        while (pn_00 = ppPVar6[uVar10], pn_00 != (PNode *)0x0) {
          ppPVar6[uVar10] = pn_00->bucket_next;
          insert_PNode_internal(p,pn_00);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
    }
    free(ppPVar6);
    uVar9 = (ulong)(p->pnode_hash).m;
    uVar8 = (p->pnode_hash).n + 1;
  }
  ppPVar6 = (p->pnode_hash).v;
  uVar9 = (ulong)(uint)((int)pDVar5 + iVar1 + (int)pcVar4 * 0x10000 + (int)pcVar3 * 0x100) % uVar9;
  pn->bucket_next = ppPVar6[uVar9];
  ppPVar6[uVar9] = pn;
  (p->pnode_hash).n = uVar8;
  return;
}

Assistant:

void insert_PNode_internal(Parser *p, PNode *pn) {
  PNodeHash *ph = &p->pnode_hash;
  uint h = PNODE_HASH(pn->parse_node.start_loc.s, pn->parse_node.end_skip, pn->parse_node.symbol, pn->initial_scope), i;
  PNode *t;

  if (ph->n + 1 > ph->m) {
    PNode **v = ph->v;
    uint m = ph->m;
    ph->i++;
    ph->m = d_prime2[ph->i];
    ph->v = (PNode **)MALLOC(ph->m * sizeof(*ph->v));
    memset(ph->v, 0, ph->m * sizeof(*ph->v));
    for (i = 0; i < m; i++)
      while ((t = v[i])) {
        v[i] = v[i]->bucket_next;
        insert_PNode_internal(p, t);
      }
    FREE(v);
  }
  pn->bucket_next = ph->v[h % ph->m];
  ph->v[h % ph->m] = pn;
  ph->n++;
}